

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O0

RK_S32 __thiscall mpp_list::add_by_key(mpp_list *this,void *data,RK_S32 size,RK_U32 *key)

{
  RK_U32 key_00;
  mpp_list_node *_new;
  mpp_list_node *node;
  RK_U32 list_key;
  RK_S32 ret;
  RK_U32 *key_local;
  RK_S32 size_local;
  void *data_local;
  mpp_list *this_local;
  
  node._4_4_ = 0;
  if (this->head != (mpp_list_node *)0x0) {
    key_00 = get_key();
    *key = key_00;
    _new = create_list(data,size,key_00);
    if (_new == (mpp_list_node *)0x0) {
      node._4_4_ = -0xc;
    }
    else {
      mpp_list_add_tail(_new,this->head);
      this->count = this->count + 1;
      node._4_4_ = 0;
    }
  }
  return node._4_4_;
}

Assistant:

RK_S32 mpp_list::add_by_key(void *data, RK_S32 size, RK_U32 *key)
{
    RK_S32 ret = 0;
    if (head) {
        RK_U32 list_key = get_key();
        *key = list_key;
        mpp_list_node *node = create_list(data, size, list_key);
        if (node) {
            mpp_list_add_tail(node, head);
            count++;
            ret = 0;
        } else {
            ret = -ENOMEM;
        }
    }
    return ret;
}